

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O2

mpack_node_data_t * mpack_node_map_int_impl(mpack_node_t node,int64_t num)

{
  int iVar1;
  mpack_node_data_t *pmVar2;
  mpack_error_t error;
  mpack_node_data_t *pmVar3;
  mpack_node_data_t *pmVar4;
  long lVar5;
  
  pmVar4 = node.data;
  if ((node.tree)->error != mpack_ok) {
    return (mpack_node_data_t *)0x0;
  }
  if (pmVar4->type == mpack_type_map) {
    pmVar3 = (mpack_node_data_t *)0x0;
    for (lVar5 = 0; (ulong)pmVar4->len << 5 != lVar5; lVar5 = lVar5 + 0x20) {
      pmVar2 = (pmVar4->value).children;
      iVar1 = *(int *)((long)&pmVar2->type + lVar5);
      if (((iVar1 == 3) || (iVar1 == 4 && -1 < num)) &&
         (*(long *)((long)&pmVar2->value + lVar5) == num)) {
        if (pmVar3 != (mpack_node_data_t *)0x0) {
          error = mpack_error_data;
          goto LAB_0010815e;
        }
        pmVar3 = (mpack_node_data_t *)((long)&pmVar2[1].type + lVar5);
      }
    }
  }
  else {
    error = mpack_error_type;
LAB_0010815e:
    mpack_tree_flag_error(node.tree,error);
    pmVar3 = (mpack_node_data_t *)0x0;
  }
  return pmVar3;
}

Assistant:

static mpack_node_data_t* mpack_node_map_int_impl(mpack_node_t node, int64_t num) {
    if (mpack_node_error(node) != mpack_ok)
        return NULL;

    if (node.data->type != mpack_type_map) {
        mpack_node_flag_error(node, mpack_error_type);
        return NULL;
    }

    mpack_node_data_t* found = NULL;

    for (size_t i = 0; i < node.data->len; ++i) {
        mpack_node_data_t* key = mpack_node_child(node, i * 2);

        if ((key->type == mpack_type_int && key->value.i == num) ||
            (key->type == mpack_type_uint && num >= 0 && key->value.u == (uint64_t)num))
        {
            if (found) {
                mpack_node_flag_error(node, mpack_error_data);
                return NULL;
            }
            found = mpack_node_child(node, i * 2 + 1);
        }
    }

    if (found)
        return found;

    return NULL;
}